

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O1

void compute_integral_img(float *gray_image,integral_image *iimage)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  float fVar9;
  
  pfVar4 = iimage->data;
  iVar1 = iimage->data_width;
  uVar2 = iimage->width;
  uVar3 = iimage->height;
  if (0 < (int)uVar2) {
    fVar9 = 0.0;
    uVar6 = 0;
    do {
      fVar9 = fVar9 + gray_image[uVar6];
      pfVar4[uVar6] = fVar9;
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  if (1 < (int)uVar3) {
    pfVar5 = gray_image + (int)uVar2;
    uVar6 = 1;
    pfVar7 = pfVar4;
    do {
      pfVar7 = pfVar7 + iVar1;
      if (0 < (int)uVar2) {
        fVar9 = 0.0;
        uVar8 = 0;
        do {
          fVar9 = fVar9 + pfVar5[uVar8];
          pfVar7[uVar8] = fVar9 + pfVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      uVar6 = uVar6 + 1;
      pfVar4 = pfVar4 + iVar1;
      pfVar5 = pfVar5 + (int)uVar2;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

void compute_integral_img(float *gray_image, struct integral_image *iimage) {
    
    float *iimage_data = iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    float row_sum = 0.0f;

    /* sum up the first row */
    for (int i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_data[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (int j = 1; j < height; ++j) {
        row_sum = 0.0f;
        for (int i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_data[j * data_width + i] = row_sum + iimage_data[(j - 1) * data_width + i];
        }
    }
}